

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

reverse_iterator * __thiscall
immutable::transient_vector<int,_true,_5>::rend
          (reverse_iterator *__return_storage_ptr__,transient_vector<int,_true,_5> *this)

{
  ref<immutable::transient_rrb<int,_true,_5>_> local_38;
  ref<immutable::transient_rrb<int,_true,_5>_> local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_20;
  int *local_18;
  
  local_38.ptr = (this->_impl).ptr;
  if (local_38.ptr != (transient_rrb<int,_true,_5> *)0x0) {
    LOCK();
    ((local_38.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((local_38.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    LOCK();
    ((local_38.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((local_38.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  local_28 = 0;
  _Stack_20.super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
  _M_head_impl = (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
  _Stack_20.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
  local_18 = (int *)0x0;
  local_30.ptr = local_38.ptr;
  ref<immutable::rrb<int,_true,_5>_>::~ref((ref<immutable::rrb<int,_true,_5>_> *)&local_38);
  (__return_storage_ptr__->current)._impl.ptr = (rrb<int,_true,_5> *)local_30.ptr;
  if (local_30.ptr != (transient_rrb<int,_true,_5> *)0x0) {
    LOCK();
    ((local_30.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((local_30.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl = local_18;
  *(ulong *)&(__return_storage_ptr__->current)._index = CONCAT44(uStack_24,local_28);
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> = _Stack_20;
  ref<immutable::rrb<int,_true,_5>_>::~ref((ref<immutable::rrb<int,_true,_5>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rend() const
        {
        return reverse_iterator{ begin() };
        }